

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_actor::state_read(se_actor *this,xr_packet *packet,uint16_t size)

{
  ushort uVar1;
  uchar uVar2;
  bool bVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  
  cse_alife_creature_actor::state_read(&this->super_cse_alife_creature_actor,packet,size);
  uVar1 = *(ushort *)
           &(this->super_cse_alife_creature_actor).super_cse_alife_creature_abstract.field_0x28;
  if (0x7f < uVar1) {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_actor");
    xr_packet::r_bool(packet);
LAB_0018bbfd:
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"se_actor");
    return;
  }
  if (uVar1 < 0x7a) {
    if ((ushort)(uVar1 - 0x27) < 0x50) {
      return;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                  ,0xa2,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
  }
  if (uVar1 < 0x7d) {
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"se_actor");
    cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CRandomTask");
    uVar4 = xr_packet::r<unsigned_short>(packet);
    if (uVar4 == 0) {
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"object_collection");
      r_object_collection(packet);
      cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"object_collection");
      uVar2 = xr_packet::r<unsigned_char>(packet);
      if (uVar2 == '\0') {
        uVar4 = xr_packet::r<unsigned_short>(packet);
        if (uVar4 == 0) {
          cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,true,"CRandomTask");
          cse_abstract::set_save_marker
                    ((cse_abstract *)this,packet,SM_LOAD,false,"object_collection");
          r_object_collection(packet);
          cse_abstract::set_save_marker
                    ((cse_abstract *)this,packet,SM_LOAD,true,"object_collection");
          cse_abstract::set_save_marker((cse_abstract *)this,packet,SM_LOAD,false,"CMinigames");
          uVar4 = xr_packet::r<unsigned_short>(packet);
          if (uVar4 == 2) {
            pcVar7 = xr_packet::skip_sz(packet);
            iVar5 = strcmp(pcVar7,"test_crowkiller");
            if (iVar5 == 0) {
              pcVar7 = xr_packet::skip_sz(packet);
              iVar5 = strcmp(pcVar7,"CMGCrowKiller");
              if (iVar5 == 0) {
                pcVar7 = xr_packet::skip_sz(packet);
                iVar5 = strcmp(pcVar7,"valiable");
                if (iVar5 == 0) {
                  cse_abstract::set_save_marker
                            ((cse_abstract *)this,packet,SM_LOAD,false,"CMGCrowKiller");
                  uVar2 = xr_packet::r<unsigned_char>(packet);
                  if (uVar2 == '\0') {
                    uVar4 = xr_packet::r<unsigned_short>(packet);
                    if (uVar4 == 0x3c) {
                      bVar3 = xr_packet::r_bool(packet);
                      if (bVar3) {
                        pcVar7 = "0";
                        uVar6 = 0x5b;
                      }
                      else {
                        uVar2 = xr_packet::r<unsigned_char>(packet);
                        if (uVar2 == '\x04') {
                          uVar6 = xr_packet::r<unsigned_int>(packet);
                          if (uVar6 == 0) {
                            uVar4 = xr_packet::r<unsigned_short>(packet);
                            if (uVar4 == 10) {
                              uVar4 = xr_packet::r<unsigned_short>(packet);
                              if (uVar4 == 100) {
                                uVar2 = xr_packet::r<unsigned_char>(packet);
                                if (uVar2 == '\0') {
                                  pcVar7 = xr_packet::skip_sz(packet);
                                  if (*pcVar7 == '\0') {
                                    uVar2 = xr_packet::r<unsigned_char>(packet);
                                    if (uVar2 == '\0') {
                                      uVar4 = xr_packet::r<unsigned_short>(packet);
                                      if (uVar4 == 0) {
                                        uVar4 = xr_packet::r<unsigned_short>(packet);
                                        if (uVar4 == 10) {
                                          uVar2 = xr_packet::r<unsigned_char>(packet);
                                          if (uVar2 == '\0') {
                                            bVar3 = xr_packet::r_bool(packet);
                                            if (bVar3) {
                                              pcVar7 = "0";
                                              uVar6 = 0x71;
                                            }
                                            else {
                                              cse_abstract::set_save_marker
                                                        ((cse_abstract *)this,packet,SM_LOAD,true,
                                                         "CMGCrowKiller");
                                              pcVar7 = xr_packet::skip_sz(packet);
                                              iVar5 = strcmp(pcVar7,"test_shooting");
                                              if (iVar5 == 0) {
                                                pcVar7 = xr_packet::skip_sz(packet);
                                                iVar5 = strcmp(pcVar7,"CMGShooting");
                                                if (iVar5 == 0) {
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"valiable");
                                                  if (iVar5 == 0) {
                                                    cse_abstract::set_save_marker
                                                              ((cse_abstract *)this,packet,SM_LOAD,
                                                               false,"CMGShooting");
                                                    pcVar7 = xr_packet::skip_sz(packet);
                                                    if (*pcVar7 == '\0') {
                                                      pcVar7 = xr_packet::skip_sz(packet);
                                                      if (*pcVar7 == '\0') {
                                                        pcVar7 = xr_packet::skip_sz(packet);
                                                        iVar5 = strcmp(pcVar7,"nil");
                                                        if (iVar5 != 0) {
                                                          __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x80,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"nil");
                                                  if (iVar5 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x82,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"nil");
                                                  if (iVar5 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x84,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"nil");
                                                  if (iVar5 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x86,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"nil");
                                                  if (iVar5 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x88,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\x01') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x8a,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar4 = xr_packet::r<unsigned_short>(packet);
                                                  if (uVar4 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x8c,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\0') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x8e,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\0') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x90,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\0') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x92,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\0') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x94,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar2 = xr_packet::r<unsigned_char>(packet);
                                                  if (uVar2 != '\0') {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x96,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  uVar6 = xr_packet::r<unsigned_int>(packet);
                                                  if (uVar6 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x98,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  pcVar7 = xr_packet::skip_sz(packet);
                                                  iVar5 = strcmp(pcVar7,"nil");
                                                  if (iVar5 != 0) {
                                                    __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                                                  ,0x9a,
                                                  "virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)"
                                                  );
                                                  }
                                                  cse_abstract::set_save_marker
                                                            ((cse_abstract *)this,packet,SM_LOAD,
                                                             true,"CMGShooting");
                                                  cse_abstract::set_save_marker
                                                            ((cse_abstract *)this,packet,SM_LOAD,
                                                             true,"CMinigames");
                                                  goto LAB_0018bbfd;
                                                  }
                                                  pcVar7 = "0";
                                                  uVar6 = 0x7e;
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    uVar6 = 0x7c;
                                                  }
                                                  }
                                                  else {
                                                    pcVar7 = "0";
                                                    uVar6 = 0x79;
                                                  }
                                                }
                                                else {
                                                  pcVar7 = "0";
                                                  uVar6 = 0x77;
                                                }
                                              }
                                              else {
                                                pcVar7 = "0";
                                                uVar6 = 0x75;
                                              }
                                            }
                                          }
                                          else {
                                            pcVar7 = "0";
                                            uVar6 = 0x6f;
                                          }
                                        }
                                        else {
                                          pcVar7 = "0";
                                          uVar6 = 0x6d;
                                        }
                                      }
                                      else {
                                        pcVar7 = "0";
                                        uVar6 = 0x6b;
                                      }
                                    }
                                    else {
                                      pcVar7 = "0";
                                      uVar6 = 0x69;
                                    }
                                  }
                                  else {
                                    pcVar7 = "0";
                                    uVar6 = 0x67;
                                  }
                                }
                                else {
                                  pcVar7 = "0";
                                  uVar6 = 0x65;
                                }
                              }
                              else {
                                pcVar7 = "0";
                                uVar6 = 99;
                              }
                            }
                            else {
                              pcVar7 = "0";
                              uVar6 = 0x61;
                            }
                          }
                          else {
                            pcVar7 = "0";
                            uVar6 = 0x5f;
                          }
                        }
                        else {
                          pcVar7 = "0";
                          uVar6 = 0x5d;
                        }
                      }
                    }
                    else {
                      pcVar7 = "0";
                      uVar6 = 0x59;
                    }
                  }
                  else {
                    pcVar7 = "0";
                    uVar6 = 0x57;
                  }
                }
                else {
                  pcVar7 = "0";
                  uVar6 = 0x54;
                }
              }
              else {
                pcVar7 = "0";
                uVar6 = 0x52;
              }
            }
            else {
              pcVar7 = "0";
              uVar6 = 0x50;
            }
          }
          else {
            pcVar7 = "0";
            uVar6 = 0x4e;
          }
        }
        else {
          pcVar7 = "0";
          uVar6 = 0x43;
        }
      }
      else {
        pcVar7 = "0";
        uVar6 = 0x41;
      }
    }
    else {
      pcVar7 = "0";
      uVar6 = 0x3b;
    }
  }
  else {
    pcVar7 = "m_version <= CSE_VERSION_CS";
    uVar6 = 0x34;
  }
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity_script.cxx"
                ,uVar6,"virtual void xray_re::se_actor::state_read(xr_packet &, uint16_t)");
}

Assistant:

void se_actor::state_read(xr_packet& packet, uint16_t size)
{
	cse_alife_creature_actor::state_read(packet, size);
	if (m_version >= CSE_VERSION_0x80) {
		set_save_marker(packet, SM_LOAD, false, "se_actor");
		
		bool start_position_filled = packet.r_bool();
		
		set_save_marker(packet, SM_LOAD, true, "se_actor");
	}
	else if (m_version >= CSE_VERSION_0x7a) {
		xr_assert(m_version <= CSE_VERSION_CS);

		set_save_marker(packet, SM_LOAD, false, "se_actor");

		// CRandomTask
		set_save_marker(packet, SM_LOAD, false, "CRandomTask");
		if (packet.r_u16())			// #inited_tasks
			xr_not_implemented();
		// CRandomTask's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");
		if (packet.r_u8())			// #rewards
			xr_not_implemented();
		if (packet.r_u16())			// #inited_find_upgrade_tasks
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CRandomTask");

		// sim_board's id_generator
		set_save_marker(packet, SM_LOAD, false, "object_collection");
		r_object_collection(packet);
		set_save_marker(packet, SM_LOAD, true, "object_collection");

		// CMinigames
		set_save_marker(packet, SM_LOAD, false, "CMinigames");
		if (packet.r_u16() != 2)		// #minigames
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "test_crowkiller"))	// first minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGCrowKiller"))	// first minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// first minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGCrowKiller");
		if (packet.r_u8())			// params_list.highscore
			xr_not_implemented();
		if (packet.r_u16() != 60)		// params_list.timer
			xr_not_implemented();
		if (packet.r_bool())			// params_list.win
			xr_not_implemented();
		if (packet.r_u8() != 4)			// #params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u32())			// params_list.crows_to_kill
			xr_not_implemented();
		if (packet.r_u16() != 10)		// params_list.money_multiplier
			xr_not_implemented();
		if (packet.r_u16() != 100)		// params_list.champion_multiplier
			xr_not_implemented();
		if (packet.r_u8())			// params_list.selected
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))	// params_list.game_type
			xr_not_implemented();
		if (packet.r_u8())			// high_score
			xr_not_implemented();
		if (packet.r_u16())			// timer
			xr_not_implemented();
		if (packet.r_u16() != 10)		// time_out
			xr_not_implemented();
		if (packet.r_u8())			// killed_counter
			xr_not_implemented();
		if (packet.r_bool())			// win
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGCrowKiller");

		if (std::strcmp(packet.skip_sz(), "test_shooting"))	// second minigame's name
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "CMGShooting"))	// second minigame's profile
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "valiable"))		// second minigame's state
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, false, "CMGShooting");
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.game_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), ""))		// params_list.wpn_type
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.stand_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.look_way_back
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// params_list.obj_name
			xr_not_implemented();
		if (packet.r_u8() != 1)				// params_list.win type
			xr_not_implemented();
		if (packet.r_u16())				// params_list.win
			xr_not_implemented();
		if (packet.r_u8())				// params_list.distance
			xr_not_implemented();
		if (packet.r_u8())				// params_list.ammo
			xr_not_implemented();
		if (packet.r_u8())				// #params_list.targets
			xr_not_implemented();
		if (packet.r_u8())				// params_list.target_counter
			xr_not_implemented();
		if (packet.r_u8())				// #inventory_items
			xr_not_implemented();
		if (packet.r_u32())				// prev_time
			xr_not_implemented();
		if (std::strcmp(packet.skip_sz(), "nil"))	// cur_game
			xr_not_implemented();
		set_save_marker(packet, SM_LOAD, true, "CMGShooting");
		set_save_marker(packet, SM_LOAD, true, "CMinigames");

		set_save_marker(packet, SM_LOAD, true, "se_actor");
	} else if (m_version >= CSE_VERSION_0x27 && m_version <= CSE_VERSION_SOC) {
		// no script entity
	} else {
		xr_not_implemented();
	}
}